

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint8x16OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDUint8x16Operation::OpLessThanOrEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar33 [16];
  SIMDValue SVar34;
  
  bVar1 = (aValue->field_0).u8[0];
  bVar2 = (aValue->field_0).u8[1];
  bVar3 = (aValue->field_0).u8[2];
  bVar4 = (aValue->field_0).u8[3];
  bVar5 = (aValue->field_0).u8[4];
  bVar6 = (aValue->field_0).u8[5];
  bVar7 = (aValue->field_0).u8[6];
  bVar8 = (aValue->field_0).u8[7];
  bVar9 = (aValue->field_0).u8[8];
  bVar10 = (aValue->field_0).u8[9];
  bVar11 = (aValue->field_0).u8[10];
  bVar12 = (aValue->field_0).u8[0xb];
  bVar13 = (aValue->field_0).u8[0xc];
  bVar14 = (aValue->field_0).u8[0xd];
  bVar15 = (aValue->field_0).u8[0xe];
  bVar16 = (aValue->field_0).u8[0xf];
  bVar17 = (bValue->field_0).u8[0];
  bVar18 = (bValue->field_0).u8[1];
  bVar19 = (bValue->field_0).u8[2];
  bVar20 = (bValue->field_0).u8[3];
  bVar21 = (bValue->field_0).u8[4];
  bVar22 = (bValue->field_0).u8[5];
  bVar23 = (bValue->field_0).u8[6];
  bVar24 = (bValue->field_0).u8[7];
  bVar25 = (bValue->field_0).u8[8];
  bVar26 = (bValue->field_0).u8[9];
  bVar27 = (bValue->field_0).u8[10];
  bVar28 = (bValue->field_0).u8[0xb];
  bVar29 = (bValue->field_0).u8[0xc];
  bVar30 = (bValue->field_0).u8[0xd];
  bVar31 = (bValue->field_0).u8[0xe];
  bVar32 = (bValue->field_0).u8[0xf];
  auVar33._0_8_ =
       CONCAT17(-((byte)((bVar8 < bVar24) * bVar8 | (bVar8 >= bVar24) * bVar24) == bVar8),
                CONCAT16(-((byte)((bVar7 < bVar23) * bVar7 | (bVar7 >= bVar23) * bVar23) == bVar7),
                         CONCAT15(-((byte)((bVar6 < bVar22) * bVar6 | (bVar6 >= bVar22) * bVar22) ==
                                   bVar6),CONCAT14(-((byte)((bVar5 < bVar21) * bVar5 |
                                                           (bVar5 >= bVar21) * bVar21) == bVar5),
                                                   CONCAT13(-((byte)((bVar4 < bVar20) * bVar4 |
                                                                    (bVar4 >= bVar20) * bVar20) ==
                                                             bVar4),CONCAT12(-((byte)((bVar3 < 
                                                  bVar19) * bVar3 | (bVar3 >= bVar19) * bVar19) ==
                                                  bVar3),CONCAT11(-((byte)((bVar2 < bVar18) * bVar2
                                                                          | (bVar2 >= bVar18) *
                                                                            bVar18) == bVar2),
                                                                  -((byte)((bVar1 < bVar17) * bVar1
                                                                          | (bVar1 >= bVar17) *
                                                                            bVar17) == bVar1))))))))
  ;
  auVar33[8] = -((byte)((bVar9 < bVar25) * bVar9 | (bVar9 >= bVar25) * bVar25) == bVar9);
  auVar33[9] = -((byte)((bVar10 < bVar26) * bVar10 | (bVar10 >= bVar26) * bVar26) == bVar10);
  auVar33[10] = -((byte)((bVar11 < bVar27) * bVar11 | (bVar11 >= bVar27) * bVar27) == bVar11);
  auVar33[0xb] = -((byte)((bVar12 < bVar28) * bVar12 | (bVar12 >= bVar28) * bVar28) == bVar12);
  auVar33[0xc] = -((byte)((bVar13 < bVar29) * bVar13 | (bVar13 >= bVar29) * bVar29) == bVar13);
  auVar33[0xd] = -((byte)((bVar14 < bVar30) * bVar14 | (bVar14 >= bVar30) * bVar30) == bVar14);
  auVar33[0xe] = -((byte)((bVar15 < bVar31) * bVar15 | (bVar15 >= bVar31) * bVar31) == bVar15);
  auVar33[0xf] = -((byte)((bVar16 < bVar32) * bVar16 | (bVar16 >= bVar32) * bVar32) == bVar16);
  SVar34.field_0.i64[1] = auVar33._8_8_;
  SVar34.field_0.i64[0] = auVar33._0_8_;
  return (SIMDValue)SVar34.field_0;
}

Assistant:

SIMDValue SIMDUint8x16Operation::OpLessThanOrEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

#pragma warning(push)
#pragma warning(disable:4838) // conversion from 'unsigned int' to 'int32' requires a narrowing conversion
        X86SIMDValue signBits = { { 0x80808080,0x80808080, 0x80808080, 0x80808080 } };
#pragma warning(pop)

        // Signed comparison of unsigned ints can be done if the ints have the "sign" bit xored with 1
        tmpaValue.m128i_value = _mm_xor_si128(tmpaValue.m128i_value, signBits.m128i_value);
        tmpbValue.m128i_value = _mm_xor_si128(tmpbValue.m128i_value, signBits.m128i_value);
        x86Result.m128i_value = _mm_cmplt_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a < b?
        tmpaValue.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
        x86Result.m128i_value = _mm_or_si128(x86Result.m128i_value, tmpaValue.m128i_value);   // result = (a<b)|(a==b)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }